

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Gia_PolynBuild2(Gia_Man_t *pGia,int fSigned,int fVerbose,int fVeryVerbose)

{
  Hsh_VecMan_t *p;
  Hsh_VecMan_t *p_00;
  int nEntries;
  
  nEntries = (int)pGia;
  p = Hsh_VecManStart(nEntries);
  p_00 = Hsh_VecManStart(nEntries);
  Hsh_VecManStop(p);
  Hsh_VecManStop(p_00);
  return;
}

Assistant:

void Gia_PolynBuild2( Gia_Man_t * pGia, int fSigned, int fVerbose, int fVeryVerbose )
{
    Hsh_VecMan_t * pHashC = Hsh_VecManStart( 1000 );    // hash table for constants
    Hsh_VecMan_t * pHashM = Hsh_VecManStart( 1000 );    // hash table for monomials
    //Vec_Wec_t * vLit2Mono = Vec_WecStart( Gia_ManObjNum(pGia) * 2 );

    Hsh_VecManStop( pHashC );
    Hsh_VecManStop( pHashM );
}